

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constants.cpp
# Opt level: O3

Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *
squareRoot(Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *__return_storage_ptr__,uint64_t x,
          uint64_t n)

{
  pointer puVar1;
  pointer puVar2;
  int8_t iVar3;
  long lVar4;
  unsigned_long *n_00;
  long x_00;
  undefined1 auVar5 [16];
  BigInt<unsigned_int,_unsigned_long> eps;
  BigInt<unsigned_int,_unsigned_long> lim;
  Frac<scp::BigInt<unsigned_int,_unsigned_long>_> local_110;
  BigInt<unsigned_int,_unsigned_long> local_c8;
  BigInt<unsigned_int,_unsigned_long> local_a8;
  double local_88;
  double dStack_80;
  Frac<scp::BigInt<unsigned_int,_unsigned_long>_> local_78;
  
  x_00 = 1;
  lVar4 = 1;
  do {
    n_00 = (unsigned_long *)(lVar4 * lVar4);
    lVar4 = lVar4 + 1;
    x_00 = x_00 + 2;
  } while (n_00 < x);
  scp::BigInt<unsigned_int,_unsigned_long>::BigInt
            ((BigInt<unsigned_int,_unsigned_long> *)&local_110,x_00);
  scp::BigInt<unsigned_int,_unsigned_long>::BigInt
            ((BigInt<unsigned_int,_unsigned_long> *)&local_78,2);
  scp::Frac<scp::BigInt<unsigned_int,_unsigned_long>_>::Frac
            (&__return_storage_ptr__->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>,
             (BigInt<unsigned_int,_unsigned_long> *)&local_110,
             (BigInt<unsigned_int,_unsigned_long> *)&local_78);
  (__return_storage_ptr__->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._vptr_Frac =
       (_func_int **)&PTR__Frac_00110bc8;
  if (local_78._vptr_Frac != (_func_int **)0x0) {
    operator_delete(local_78._vptr_Frac,
                    (long)local_78._p._values.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_78._vptr_Frac);
  }
  if (local_110._vptr_Frac != (_func_int **)0x0) {
    operator_delete(local_110._vptr_Frac,
                    (long)local_110._p._values.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_110._vptr_Frac);
  }
  scp::BigInt<unsigned_int,_unsigned_long>::BigInt
            ((BigInt<unsigned_int,_unsigned_long> *)&local_110,10);
  local_78._vptr_Frac = (_func_int **)(n + 1);
  scp::pow<scp::BigInt<unsigned_int,unsigned_long>,unsigned_long>
            (&local_a8,(scp *)&local_110,(BigInt<unsigned_int,_unsigned_long> *)&local_78,n_00);
  if (local_110._vptr_Frac != (_func_int **)0x0) {
    operator_delete(local_110._vptr_Frac,
                    (long)local_110._p._values.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_110._vptr_Frac);
  }
  scp::BigInt<unsigned_int,_unsigned_long>::BigInt(&local_c8,2);
  iVar3 = scp::BigInt<unsigned_int,_unsigned_long>::compare(&local_c8,&local_a8);
  if (iVar3 < '\0') {
    auVar5._8_4_ = (int)(x >> 0x20);
    auVar5._0_8_ = x;
    auVar5._12_4_ = 0x45300000;
    dStack_80 = auVar5._8_8_ - 1.9342813113834067e+25;
    local_88 = dStack_80 + ((double)CONCAT44(0x43300000,(int)x) - 4503599627370496.0);
    do {
      scp::BigInt<unsigned_int,_unsigned_long>::operator*=(&local_c8,&local_c8);
      scp::operator*((Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *)&local_110,
                     __return_storage_ptr__,__return_storage_ptr__);
      scp::Rational<scp::BigInt<unsigned_int,_unsigned_long>_>::operator+=
                ((Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *)&local_110,local_88);
      scp::operator*((Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *)&local_78,2.0,
                     __return_storage_ptr__);
      scp::Rational<scp::BigInt<unsigned_int,_unsigned_long>_>::operator/=
                ((Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *)&local_110,
                 (Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *)&local_78);
      puVar1 = (__return_storage_ptr__->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._p.
               _values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (__return_storage_ptr__->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._p.
               _values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._p._values.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_110._p._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._p._values.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_110._p._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._p._values.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_110._p._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_110._p._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_110._p._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_110._p._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1,(long)puVar2 - (long)puVar1);
      }
      (__return_storage_ptr__->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._p._positive =
           local_110._p._positive;
      puVar1 = (__return_storage_ptr__->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._q.
               _values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (__return_storage_ptr__->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._q.
               _values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._q._values.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_110._q._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._q._values.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_110._q._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._q._values.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_110._q._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_110._q._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_110._q._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_110._q._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1,(long)puVar2 - (long)puVar1);
      }
      (__return_storage_ptr__->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._q._positive =
           local_110._q._positive;
      scp::Frac<scp::BigInt<unsigned_int,_unsigned_long>_>::~Frac(&local_78);
      scp::Frac<scp::BigInt<unsigned_int,_unsigned_long>_>::~Frac(&local_110);
      iVar3 = scp::BigInt<unsigned_int,_unsigned_long>::compare(&local_c8,&local_a8);
    } while (iVar3 < '\0');
  }
  if (local_c8._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8._values.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8._values.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a8._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8._values.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8._values.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

scp::Rational<> squareRoot(uint64_t x, uint64_t n)
{
	int64_t y = 1;
	while (y*y < x)
	{
		++y;
	}

	scp::Rational<> result = { 2 * y + 1, 2 };
	scp::BigInt<> lim = scp::pow(scp::BigInt<>(10), n + 1);
	scp::BigInt<> eps = 2;
	while (eps < lim)
	{
		eps *= eps;
		result = (result*result + x) / (2 * result);
	}

	return result;
}